

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

void __thiscall flatbuffers::rust::RustGenerator::GenEnum(RustGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  const_iterator cVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  EnumVal *ev;
  EnumVal *ev_00;
  long *plVar7;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  char *__s;
  string num_fields;
  string deprecation_warning;
  string local_f20;
  key_type local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  IdlNamer *local_ec0;
  string local_eb8;
  long *local_e98 [2];
  long local_e88 [2];
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  key_type local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = (((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations;
  __s = "pub";
  if (bVar3 == true) {
    local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"private","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(enum_def->super_Definition).attributes,&local_a38);
    if (((_Rb_tree_header *)cVar4._M_node !=
         &(enum_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) &&
       (__s = "pub(crate)", *(long *)(cVar4._M_node + 2) == 0)) {
      __s = "pub";
    }
  }
  if ((bVar3 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2)) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_f00.field_2;
  local_f00._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ACCESS_TYPE","");
  local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,__s,__s + sVar5);
  this_00 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_f00);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != paVar2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  local_f00._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ENUM_TY","");
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_f20,pIVar1,enum_def);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_f00);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != paVar2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  local_f00._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"BASE_TYPE","");
  GetEnumTypeForDecl_abi_cxx11_(&local_f20,this,&enum_def->underlying_type);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_f00);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != paVar2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  local_f00._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ENUM_NAMESPACE","");
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_f20,pIVar1,enum_def,(ulong)(this->namer_).super_Namer.config_.namespaces);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_f00);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != paVar2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  local_f00._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ENUM_CONSTANT","");
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_f20,pIVar1,enum_def,(ulong)(this->namer_).super_Namer.config_.constants);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_f00);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  local_ec0 = pIVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != paVar2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  ev = EnumDef::MinValue(enum_def);
  ev_00 = EnumDef::MaxValue(enum_def);
  if ((ev != (EnumVal *)0x0) && (ev_00 != (EnumVal *)0x0)) {
    local_f00._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ENUM_MIN_BASE_VALUE","");
    EnumDef::ToString_abi_cxx11_(&local_f20,enum_def,ev);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_f00);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
      operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f00._M_dataplus._M_p != paVar2) {
      operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
    }
    local_f00._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ENUM_MAX_BASE_VALUE","");
    EnumDef::ToString_abi_cxx11_(&local_f20,enum_def,ev_00);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_f00);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
      operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f00._M_dataplus._M_p != paVar2) {
      operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar3) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"#[allow(non_upper_case_globals)]","");
      CodeWriter::operator+=(this_00,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"mod bitflags_{{ENUM_NAMESPACE}} {","");
      CodeWriter::operator+=(this_00,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"  flatbuffers::bitflags::bitflags! {","");
      CodeWriter::operator+=(this_00,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      GenComment(this,&(enum_def->super_Definition).doc_comment,"    ");
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"    #[derive(Default)]","");
      CodeWriter::operator+=(this_00,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {","");
      CodeWriter::operator+=(this_00,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_118._8_8_ = 0;
      pcStack_100 = std::
                    _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:734:35)>
                    ::_M_invoke;
      local_108 = std::
                  _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:734:35)>
                  ::_M_manager;
      local_118._M_unused._M_object = this;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_118);
      if (local_108 != (code *)0x0) {
        (*local_108)(&local_118,&local_118,__destroy_functor);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"    }","");
      CodeWriter::operator+=(this_00,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"  }","");
      CodeWriter::operator+=(this_00,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"}","");
      CodeWriter::operator+=(this_00,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,"pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};","");
      CodeWriter::operator+=(this_00,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
      CodeWriter::operator+=(this_00,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      local_f00._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"INTO_BASE","");
      local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,"self.bits()","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_f00);
      std::__cxx11::string::_M_assign((string *)pmVar6);
    }
    else {
      local_f00._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f00,
                 "#[deprecated(since = \"2.0.0\", note = \"Use associated constants instead. This will no longer be generated in 2021.\")]"
                 ,"");
      local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a58,local_f00._M_dataplus._M_p,
                 local_f00._M_dataplus._M_p + local_f00._M_string_length);
      CodeWriter::operator+=(this_00,&local_a58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
        operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
      }
      local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a78,
                 "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};",""
                );
      CodeWriter::operator+=(this_00,&local_a78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
        operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
      }
      local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a98,local_f00._M_dataplus._M_p,
                 local_f00._M_dataplus._M_p + local_f00._M_string_length);
      CodeWriter::operator+=(this_00,&local_a98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
        operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
      }
      local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ab8,
                 "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};",""
                );
      CodeWriter::operator+=(this_00,&local_ab8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
        operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
      }
      NumToString<unsigned_long>
                (&local_f20,
                 (long)(enum_def->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(enum_def->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ad8,local_f00._M_dataplus._M_p,
                 local_f00._M_dataplus._M_p + local_f00._M_string_length);
      CodeWriter::operator+=(this_00,&local_ad8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
        operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
      }
      local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_af8,"#[allow(non_camel_case_types)]","");
      CodeWriter::operator+=(this_00,&local_af8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
        operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_ee0,"pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; ",&local_f20
                    );
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_ee0);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_eb8.field_2._M_allocated_capacity = *psVar8;
        local_eb8.field_2._8_8_ = plVar7[3];
        local_eb8._M_dataplus._M_p = (pointer)&local_eb8.field_2;
      }
      else {
        local_eb8.field_2._M_allocated_capacity = *psVar8;
        local_eb8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_eb8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_eb8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
        operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_ee0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != paVar9) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
      pcStack_120 = std::
                    _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:764:35)>
                    ::_M_invoke;
      local_128 = std::
                  _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:764:35)>
                  ::_M_manager;
      local_138._M_unused._M_object = this;
      local_138._8_8_ = enum_def;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_138);
      if (local_128 != (code *)0x0) {
        (*local_128)(&local_138,&local_138,__destroy_functor);
      }
      local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"];","");
      CodeWriter::operator+=(this_00,&local_b18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
        operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
      }
      local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"");
      CodeWriter::operator+=(this_00,&local_b38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
        operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
      }
      GenComment(this,&(enum_def->super_Definition).doc_comment,"");
      local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b58,
                 "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, Default)]","");
      CodeWriter::operator+=(this_00,&local_b58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
        operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
      }
      local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b78,"#[repr(transparent)]","");
      CodeWriter::operator+=(this_00,&local_b78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
        operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
      }
      local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b98,"{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});","");
      CodeWriter::operator+=(this_00,&local_b98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
        operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
      }
      local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bb8,"#[allow(non_upper_case_globals)]","");
      CodeWriter::operator+=(this_00,&local_bb8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
        operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
      }
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"impl {{ENUM_TY}} {","");
      CodeWriter::operator+=(this_00,&local_bd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      local_158._8_8_ = 0;
      pcStack_140 = std::
                    _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:781:35)>
                    ::_M_invoke;
      local_148 = std::
                  _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:781:35)>
                  ::_M_manager;
      local_158._M_unused._M_object = this;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_158);
      if (local_148 != (code *)0x0) {
        (*local_148)(&local_158,&local_158,__destroy_functor);
      }
      local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf8,"");
      CodeWriter::operator+=(this_00,&local_bf8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
        operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
      }
      local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c18,
                 "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};","");
      CodeWriter::operator+=(this_00,&local_c18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
        operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
      }
      local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c38,
                 "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};","");
      CodeWriter::operator+=(this_00,&local_c38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
        operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
      }
      local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c58,"  pub const ENUM_VALUES: &\'static [Self] = &[","");
      CodeWriter::operator+=(this_00,&local_c58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
        operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
      }
      local_178._8_8_ = 0;
      pcStack_160 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:790:34)>
                    ::_M_invoke;
      local_168 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:790:34)>
                  ::_M_manager;
      local_178._M_unused._M_object = this;
      ForAllEnumValues(this,enum_def,(function<void_()> *)&local_178);
      if (local_168 != (code *)0x0) {
        (*local_168)(&local_178,&local_178,__destroy_functor);
      }
      local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"  ];","");
      CodeWriter::operator+=(this_00,&local_c78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
        operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
      }
      local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c98,"  /// Returns the variant\'s name or \"\" if unknown.","");
      CodeWriter::operator+=(this_00,&local_c98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
        operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
      }
      local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cb8,"  pub fn variant_name(self) -> Option<&\'static str> {","");
      CodeWriter::operator+=(this_00,&local_cb8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
        operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
      }
      local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd8,"    match self {","");
      CodeWriter::operator+=(this_00,&local_cd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
      }
      local_198._8_8_ = 0;
      pcStack_180 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:795:34)>
                    ::_M_invoke;
      local_188 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:795:34)>
                  ::_M_manager;
      local_198._M_unused._M_object = this;
      ForAllEnumValues(this,enum_def,(function<void_()> *)&local_198);
      if (local_188 != (code *)0x0) {
        (*local_188)(&local_198,&local_198,__destroy_functor);
      }
      local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf8,"      _ => None,","");
      CodeWriter::operator+=(this_00,&local_cf8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
        operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
      }
      local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,"    }","");
      CodeWriter::operator+=(this_00,&local_d18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
        operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
      }
      local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d38,"  }","");
      CodeWriter::operator+=(this_00,&local_d38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
        operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
      }
      local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d58,"}","");
      CodeWriter::operator+=(this_00,&local_d58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
        operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
      }
      local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d78,"impl core::fmt::Debug for {{ENUM_TY}} {","");
      CodeWriter::operator+=(this_00,&local_d78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
        operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
      }
      local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d98,
                 "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {","");
      CodeWriter::operator+=(this_00,&local_d98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
        operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
      }
      local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db8,"    if let Some(name) = self.variant_name() {","");
      CodeWriter::operator+=(this_00,&local_db8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
        operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
      }
      local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_dd8,"      f.write_str(name)","");
      CodeWriter::operator+=(this_00,&local_dd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
        operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
      }
      local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_df8,"    } else {","");
      CodeWriter::operator+=(this_00,&local_df8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
        operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
      }
      local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e18,"      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))",
                 "");
      CodeWriter::operator+=(this_00,&local_e18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
        operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
      }
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e38,"    }","");
      CodeWriter::operator+=(this_00,&local_e38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
      }
      local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e58,"  }","");
      CodeWriter::operator+=(this_00,&local_e58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
        operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
      }
      local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e78,"}","");
      CodeWriter::operator+=(this_00,&local_e78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
        operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1);
      }
      local_ee0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee0,"INTO_BASE","");
      local_e98[0] = local_e88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e98,"self.0","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_ee0);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if (local_e98[0] != local_e88) {
        operator_delete(local_e98[0],local_e88[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != paVar9) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
      operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f00._M_dataplus._M_p != paVar2) {
      operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"impl Serialize for {{ENUM_TY}} {","");
      CodeWriter::operator+=(this_00,&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_318,
                 "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>","");
      CodeWriter::operator+=(this_00,&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"  where","");
      CodeWriter::operator+=(this_00,&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"    S: Serializer,","");
      CodeWriter::operator+=(this_00,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"  {","");
      CodeWriter::operator+=(this_00,&local_378);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
      if (bVar3) {
        paVar9 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"    serializer.serialize_u32(self.bits() as u32)","");
        CodeWriter::operator+=(this_00,&local_50);
        _Var10._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar9 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 as u32, self.variant_name().unwrap())"
                   ,"");
        CodeWriter::operator+=(this_00,&local_70);
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar9) {
        operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
      }
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"  }","");
      CodeWriter::operator+=(this_00,&local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"}","");
      CodeWriter::operator+=(this_00,&local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
      CodeWriter::operator+=(this_00,&local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
    }
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f8,"impl<\'a> flatbuffers::Follow<\'a> for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"  type Inner = Self;","");
    CodeWriter::operator+=(this_00,&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_458,
               "  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {","");
    CodeWriter::operator+=(this_00,&local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_478,
               "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);","");
    CodeWriter::operator+=(this_00,&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar3) {
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"    // Safety:","");
      CodeWriter::operator+=(this_00,&local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4b8,
                 "    // This is safe because we know bitflags is implemented with a repr transparent uint of the correct size."
                 ,"");
      CodeWriter::operator+=(this_00,&local_4b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4d8,
                 "    // from_bits_unchecked will be replaced by an equivalent but safe from_bits_retain in bitflags 2.0"
                 ,"");
      CodeWriter::operator+=(this_00,&local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4f8,"    // https://github.com/bitflags/bitflags/issues/262","");
      CodeWriter::operator+=(this_00,&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"    Self::from_bits_unchecked(b)","");
      CodeWriter::operator+=(this_00,&local_90);
      _Var10._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar9 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"    Self(b)","");
      CodeWriter::operator+=(this_00,&local_b0);
      _Var10._M_p = local_b0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != paVar9) {
      operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
    }
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"  }","");
    CodeWriter::operator+=(this_00,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"}","");
    CodeWriter::operator+=(this_00,&local_538);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"");
    CodeWriter::operator+=(this_00,&local_558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_578,"impl flatbuffers::Push for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_598,"    type Output = {{ENUM_TY}};","");
    CodeWriter::operator+=(this_00,&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"    #[inline]","");
    CodeWriter::operator+=(this_00,&local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5d8,
               "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {","");
    CodeWriter::operator+=(this_00,&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f8,
               "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, {{INTO_BASE}});","");
    CodeWriter::operator+=(this_00,&local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"    }","");
    CodeWriter::operator+=(this_00,&local_618);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p != &local_618.field_2) {
      operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
    }
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"}","");
    CodeWriter::operator+=(this_00,&local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
    }
    local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"");
    CodeWriter::operator+=(this_00,&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
    }
    local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_678,"impl flatbuffers::EndianScalar for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
    }
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_698,"  type Scalar = {{BASE_TYPE}};","");
    CodeWriter::operator+=(this_00,&local_698);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
    }
    local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_6b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6d8,"  fn to_little_endian(self) -> {{BASE_TYPE}} {","");
    CodeWriter::operator+=(this_00,&local_6d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6f8,"    {{INTO_BASE}}.to_le()","");
    CodeWriter::operator+=(this_00,&local_6f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"  }","");
    CodeWriter::operator+=(this_00,&local_718);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p != &local_718.field_2) {
      operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
    }
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_738);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p != &local_738.field_2) {
      operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
    }
    local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_758,"  #[allow(clippy::wrong_self_convention)]","");
    CodeWriter::operator+=(this_00,&local_758);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_778,"  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {","");
    CodeWriter::operator+=(this_00,&local_778);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
    }
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_798,"    let b = {{BASE_TYPE}}::from_le(v);","");
    CodeWriter::operator+=(this_00,&local_798);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar3) {
      local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"    // Safety:","");
      CodeWriter::operator+=(this_00,&local_7b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7d8,
                 "    // This is safe because we know bitflags is implemented with a repr transparent uint of the correct size."
                 ,"");
      CodeWriter::operator+=(this_00,&local_7d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7f8,
                 "    // from_bits_unchecked will be replaced by an equivalent but safe from_bits_retain in bitflags 2.0"
                 ,"");
      CodeWriter::operator+=(this_00,&local_7f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
        operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
      }
      local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_818,"    // https://github.com/bitflags/bitflags/issues/262","");
      CodeWriter::operator+=(this_00,&local_818);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_818._M_dataplus._M_p != &local_818.field_2) {
        operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"    unsafe { Self::from_bits_unchecked(b) }","");
      CodeWriter::operator+=(this_00,&local_d0);
      _Var10._M_p = local_d0._M_dataplus._M_p;
    }
    else {
      paVar9 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"    Self(b)","");
      CodeWriter::operator+=(this_00,&local_f0);
      _Var10._M_p = local_f0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != paVar9) {
      operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
    }
    local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"  }","");
    CodeWriter::operator+=(this_00,&local_838);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"}","");
    CodeWriter::operator+=(this_00,&local_858);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_dataplus._M_p != &local_858.field_2) {
      operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
    }
    local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"");
    CodeWriter::operator+=(this_00,&local_878);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_878._M_dataplus._M_p != &local_878.field_2) {
      operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
    }
    local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_898,"impl<\'a> flatbuffers::Verifiable for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_898);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._M_dataplus._M_p != &local_898.field_2) {
      operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
    }
    local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_8b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
      operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
    }
    local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"  fn run_verifier(","");
    CodeWriter::operator+=(this_00,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
      operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
    }
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8f8,"    v: &mut flatbuffers::Verifier, pos: usize","");
    CodeWriter::operator+=(this_00,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
    }
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {","");
    CodeWriter::operator+=(this_00,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_938,"    use self::flatbuffers::Verifiable;","");
    CodeWriter::operator+=(this_00,&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_938._M_dataplus._M_p != &local_938.field_2) {
      operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
    }
    local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_958,"    {{BASE_TYPE}}::run_verifier(v, pos)","");
    CodeWriter::operator+=(this_00,&local_958);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_958._M_dataplus._M_p != &local_958.field_2) {
      operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
    }
    local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"  }","");
    CodeWriter::operator+=(this_00,&local_978);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_978._M_dataplus._M_p != &local_978.field_2) {
      operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
    }
    local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"}","");
    CodeWriter::operator+=(this_00,&local_998);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._M_dataplus._M_p != &local_998.field_2) {
      operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
    }
    local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"");
    CodeWriter::operator+=(this_00,&local_9b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
      operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
    }
    local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9d8,"impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}","")
    ;
    CodeWriter::operator+=(this_00,&local_9d8);
    pIVar1 = local_ec0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
      operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
    }
    if (enum_def->is_union == true) {
      local_f00._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"UNION_TYPE","");
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_f20,pIVar1,enum_def);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_f00);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
        operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f00._M_dataplus._M_p != paVar2) {
        operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
      }
      local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9f8,"{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}","")
      ;
      CodeWriter::operator+=(this_00,&local_9f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
        operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
      }
      local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"");
      CodeWriter::operator+=(this_00,&local_a18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
        operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
      }
      if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
        GenUnionObject(this,enum_def);
      }
    }
    return;
  }
  __assert_fail("minv && maxv",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x2cf,"void flatbuffers::rust::RustGenerator::GenEnum(const EnumDef &)");
}

Assistant:

void GenEnum(const EnumDef &enum_def) {
    const bool is_private = parser_.opts.no_leak_private_annotations &&
                            (enum_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    code_.SetValue("ENUM_TY", namer_.Type(enum_def));
    code_.SetValue("BASE_TYPE", GetEnumTypeForDecl(enum_def.underlying_type));
    code_.SetValue("ENUM_NAMESPACE", namer_.Namespace(enum_def.name));
    code_.SetValue("ENUM_CONSTANT", namer_.Constant(enum_def.name));
    const EnumVal *minv = enum_def.MinValue();
    const EnumVal *maxv = enum_def.MaxValue();
    FLATBUFFERS_ASSERT(minv && maxv);
    code_.SetValue("ENUM_MIN_BASE_VALUE", enum_def.ToString(*minv));
    code_.SetValue("ENUM_MAX_BASE_VALUE", enum_def.ToString(*maxv));

    if (IsBitFlagsEnum(enum_def)) {
      // Defer to the convenient and canonical bitflags crate. We declare it in
      // a module to #allow camel case constants in a smaller scope. This
      // matches Flatbuffers c-modeled enums where variants are associated
      // constants but in camel case.
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "mod bitflags_{{ENUM_NAMESPACE}} {";
      code_ += "  flatbuffers::bitflags::bitflags! {";
      GenComment(enum_def.doc_comment, "    ");
      code_ += "    #[derive(Default)]";
      code_ += "    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment, "    ");
        code_ += "    const {{VARIANT}} = {{VALUE}};";
      });
      code_ += "    }";
      code_ += "  }";
      code_ += "}";
      code_ += "pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};";
      code_ += "";

      code_.SetValue("INTO_BASE", "self.bits()");
    } else {
      // Normal, c-modelled enums.
      // Deprecated associated constants;
      const std::string deprecation_warning =
          "#[deprecated(since = \"2.0.0\", note = \"Use associated constants"
          " instead. This will no longer be generated in 2021.\")]";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MIN_BASE_VALUE}};";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MAX_BASE_VALUE}};";
      auto num_fields = NumToString(enum_def.size());
      code_ += deprecation_warning;
      code_ += "#[allow(non_camel_case_types)]";
      code_ += "pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; " +
               num_fields + "] = [";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        code_ += namer_.EnumVariant(enum_def, ev) + ",";
      });
      code_ += "];";
      code_ += "";

      GenComment(enum_def.doc_comment);
      // Derive Default to be 0. flatc enforces this when the enum
      // is put into a struct, though this isn't documented behavior, it is
      // needed to derive defaults in struct objects.
      code_ +=
          "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, "
          "Default)]";
      code_ += "#[repr(transparent)]";
      code_ += "{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});";
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "impl {{ENUM_TY}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment);
        code_ += "pub const {{VARIANT}}: Self = Self({{VALUE}});";
      });
      code_ += "";
      // Generate Associated constants
      code_ += "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};";
      code_ += "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};";
      code_ += "  pub const ENUM_VALUES: &'static [Self] = &[";
      ForAllEnumValues(enum_def, [&]() { code_ += "  Self::{{VARIANT}},"; });
      code_ += "  ];";
      code_ += "  /// Returns the variant's name or \"\" if unknown.";
      code_ += "  pub fn variant_name(self) -> Option<&'static str> {";
      code_ += "    match self {";
      ForAllEnumValues(enum_def, [&]() {
        code_ += "    Self::{{VARIANT}} => Some(\"{{VARIANT}}\"),";
      });
      code_ += "      _ => None,";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      // Generate Debug. Unknown variants are printed like "<UNKNOWN 42>".
      code_ += "impl core::fmt::Debug for {{ENUM_TY}} {";
      code_ +=
          "  fn fmt(&self, f: &mut core::fmt::Formatter) ->"
          " core::fmt::Result {";
      code_ += "    if let Some(name) = self.variant_name() {";
      code_ += "      f.write_str(name)";
      code_ += "    } else {";
      code_ += "      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_.SetValue("INTO_BASE", "self.0");
    }

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      code_ += "impl Serialize for {{ENUM_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (IsBitFlagsEnum(enum_def)) {
        code_ += "    serializer.serialize_u32(self.bits() as u32)";
      } else {
        code_ +=
            "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 "
            "as "
            "u32, self.variant_name().unwrap())";
      }
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate Follow and Push so we can serialize and stuff.
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{ENUM_TY}} {";
    code_ += "  type Inner = Self;";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ +=
        "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);";
    if (IsBitFlagsEnum(enum_def)) {
      // Safety:
      // This is safe because we know bitflags is implemented with a repr
      // transparent uint of the correct size. from_bits_unchecked will be
      // replaced by an equivalent but safe from_bits_retain in bitflags 2.0
      // https://github.com/bitflags/bitflags/issues/262
      code_ += "    // Safety:";
      code_ +=
          "    // This is safe because we know bitflags is implemented with a "
          "repr transparent uint of the correct size.";
      code_ +=
          "    // from_bits_unchecked will be replaced by an equivalent but "
          "safe from_bits_retain in bitflags 2.0";
      code_ += "    // https://github.com/bitflags/bitflags/issues/262";
      code_ += "    Self::from_bits_unchecked(b)";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::Push for {{ENUM_TY}} {";
    code_ += "    type Output = {{ENUM_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, "
        "{{INTO_BASE}});";
    code_ += "    }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::EndianScalar for {{ENUM_TY}} {";
    code_ += "  type Scalar = {{BASE_TYPE}};";
    code_ += "  #[inline]";
    code_ += "  fn to_little_endian(self) -> {{BASE_TYPE}} {";
    code_ += "    {{INTO_BASE}}.to_le()";
    code_ += "  }";
    code_ += "  #[inline]";
    code_ += "  #[allow(clippy::wrong_self_convention)]";
    code_ += "  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {";
    code_ += "    let b = {{BASE_TYPE}}::from_le(v);";
    if (IsBitFlagsEnum(enum_def)) {
      // Safety:
      // This is safe because we know bitflags is implemented with a repr
      // transparent uint of the correct size. from_bits_unchecked will be
      // replaced by an equivalent but safe from_bits_retain in bitflags 2.0
      // https://github.com/bitflags/bitflags/issues/262
      code_ += "    // Safety:";
      code_ +=
          "    // This is safe because we know bitflags is implemented with a "
          "repr transparent uint of the correct size.";
      code_ +=
          "    // from_bits_unchecked will be replaced by an equivalent but "
          "safe from_bits_retain in bitflags 2.0";
      code_ += "    // https://github.com/bitflags/bitflags/issues/262";
      code_ += "    unsafe { Self::from_bits_unchecked(b) }";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate verifier - deferring to the base type.
    code_ += "impl<'a> flatbuffers::Verifiable for {{ENUM_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    {{BASE_TYPE}}::run_verifier(v, pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";
    // Enums are basically integers.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}";

    if (enum_def.is_union) {
      // Generate typesafe offset(s) for unions
      code_.SetValue("UNION_TYPE", namer_.Type(enum_def));
      code_ += "{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}";
      code_ += "";
      if (parser_.opts.generate_object_based_api) { GenUnionObject(enum_def); }
    }
  }